

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<long,_long_long,_17>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *lhs,longlong *rhs,longlong *result)

{
  code *pcVar1;
  bool bVar2;
  long tmp_00;
  long *in_RDX;
  longlong *in_RSI;
  long *in_RDI;
  int64_t tmp;
  
  tmp_00 = *in_RDI - *in_RSI;
  if (SBORROW8(*in_RDI,*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (*in_RDI < 0) {
    bVar2 = subtract_corner_case_max<long_long,_long,_false>::isOverflowNegative
                      (in_RSI,in_RDI,tmp_00);
    if (bVar2) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  else {
    bVar2 = subtract_corner_case_max<long_long,_long,_false>::isOverflowPositive
                      (in_RSI,in_RDI,tmp_00);
    if (bVar2) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  *in_RDX = tmp_00;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs std::int64_t, rhs any signed int (including std::int64_t)
        std::int64_t tmp = lhs - rhs;

        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible in tmp
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible in tmp

        if( lhs >= 0 )
        {
            // if both positive, overflow to negative not possible
            // which is why we'll explicitly check maxInt, and not call SafeCast
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit>::isOverflowPositive(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }
        else
        {
            // lhs negative
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit >::isOverflowNegative(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }

        result = (T)tmp;
    }